

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O3

void TasOptimization::makeNesterovTestFunction
               (double L,int k,ObjectiveFunctionSingle *func,GradientFunctionSingle *grad,
               vector<double,_std::allocator<double>_> *minimum)

{
  pointer __s;
  pointer pdVar1;
  pointer pdVar2;
  double dVar3;
  undefined1 auVar4 [16];
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  long lVar9;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  double local_20;
  
  local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(func->super__Function_base)._M_functor;
  local_48._8_8_ = *(undefined8 *)((long)&(func->super__Function_base)._M_functor + 8);
  *(double *)&(func->super__Function_base)._M_functor = L;
  *(int *)((long)&(func->super__Function_base)._M_functor + 8) = k;
  local_38 = (func->super__Function_base)._M_manager;
  (func->super__Function_base)._M_manager =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:249:12)>
       ::_M_manager;
  local_30 = (_Invoker_type)func->_M_invoker;
  func->_M_invoker =
       std::
       _Function_handler<double_(const_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:249:12)>
       ::_M_invoke;
  local_20 = L;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  local_48._M_unused._0_8_ = (undefined8)*(undefined8 *)&(grad->super__Function_base)._M_functor;
  local_48._8_8_ = *(undefined8 *)((long)&(grad->super__Function_base)._M_functor + 8);
  *(double *)&(grad->super__Function_base)._M_functor = local_20;
  *(int *)((long)&(grad->super__Function_base)._M_functor + 8) = k;
  local_38 = (grad->super__Function_base)._M_manager;
  (grad->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:258:12)>
       ::_M_manager;
  local_30 = grad->_M_invoker;
  grad->_M_invoker =
       std::
       _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:258:12)>
       ::_M_invoke;
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  pdVar1 = (minimum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (minimum->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  __s = pdVar1 + k;
  if (__s != pdVar2) {
    memset(__s,0,((long)pdVar2 + (-8 - (long)__s) & 0xfffffffffffffff8U) + 8);
  }
  auVar4 = _DAT_0011b8b0;
  if (0 < k) {
    dVar3 = (double)(k + 1U);
    lVar5 = (ulong)(uint)k - 1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    lVar5 = 0;
    auVar6 = auVar6 ^ _DAT_0011b8b0;
    auVar7 = _DAT_0011b8a0;
    do {
      auVar8 = auVar7 ^ auVar4;
      lVar9 = auVar7._8_8_;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        *(double *)((long)pdVar1 + lVar5) = 1.0 - (double)(int)(auVar7._0_8_ + 1) / dVar3;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        *(double *)((long)pdVar1 + lVar5 + 8) = 1.0 - (double)(int)(lVar9 + 1) / dVar3;
      }
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar9 + 2;
      lVar5 = lVar5 + 0x10;
    } while ((ulong)(k + 1U >> 1) << 4 != lVar5);
  }
  return;
}

Assistant:

void makeNesterovTestFunction(const double L, const int k, ObjectiveFunctionSingle &func, GradientFunctionSingle &grad,
                              std::vector<double> &minimum) {
    func = [=](const std::vector<double> &x)->double {
        double result = (L / 4.0) * ((1.0 / 2.0) * (x[0] * x[0] + x[k-1] * x[k-1]) - x[0]);
        double delta;
        for (int i=0; i<k-1; i++) {
            delta = x[i] - x[i+1];
            result += (L / 8.0) * (delta * delta);
        }
        return result;
    };
    grad = [=](const std::vector<double> &x, std::vector<double> &gx)->void {
        std::fill(gx.begin(), gx.end(), 0);
        gx[0] = (L / 4.0) * (x[0] - 1.0);
        gx[k-1] = (L / 4.0) * x[k-1];
        for (int i=0; i<k-1; i++) {
            gx[i] += (L / 4.0) * (x[i] - x[i+1]);
            gx[i+1] -= (L / 4.0) * (x[i] - x[i+1]);
        }
    };
    std::fill(minimum.begin() + k, minimum.end(), 0);
    for (int i=0; i<k; i++) {
        minimum[i] = 1.0 - ((double) i + 1.0) / (k + 1.0);
    }
}